

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

Pos getLinkedGatewayChunk(EndNoise *en,SurfaceNoise *sn,uint64_t seed,Pos src,Pos *dst)

{
  int iVar1;
  int iVar2;
  Pos PVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Pos PVar11;
  double __x;
  double dVar12;
  double dVar13;
  
  iVar4 = src.x;
  iVar6 = src.z;
  dVar12 = 1.0 / SQRT((double)(iVar6 * iVar6 + iVar4 * iVar4));
  dVar13 = dVar12 * (double)iVar4;
  dVar12 = dVar12 * (double)iVar6;
  dVar8 = dVar13 * 1024.0;
  __x = dVar12 * 1024.0;
  dVar13 = dVar13 * 16.0;
  dVar12 = dVar12 * 16.0;
  dVar9 = floor(dVar8);
  iVar4 = (int)dVar9 >> 4;
  dVar9 = floor(__x);
  iVar6 = (int)dVar9 >> 4;
  iVar1 = isEndChunkEmpty(en,sn,seed,iVar4,iVar6);
  if (iVar1 == 0) {
    dVar8 = dVar8 - dVar13;
    __x = __x - dVar12;
    dVar9 = floor(dVar8);
    dVar10 = floor(__x);
    iVar1 = isEndChunkEmpty(en,sn,seed,(int)dVar9 >> 4,(int)dVar10 >> 4);
    if (iVar1 == 0) {
      iVar7 = 0xf;
      iVar1 = (int)dVar9 >> 4;
      iVar5 = (int)dVar10 >> 4;
      do {
        iVar6 = iVar5;
        iVar7 = iVar7 + -1;
        iVar4 = iVar1;
        if (iVar7 == 0) break;
        dVar8 = dVar8 - dVar13;
        __x = __x - dVar12;
        dVar9 = floor(dVar8);
        dVar10 = floor(__x);
        iVar2 = isEndChunkEmpty(en,sn,seed,(int)dVar9 >> 4,(int)dVar10 >> 4);
        iVar1 = (int)dVar9 >> 4;
        iVar5 = (int)dVar10 >> 4;
      } while (iVar2 == 0);
    }
  }
  else {
    iVar1 = 0xf;
    do {
      dVar8 = dVar8 + dVar13;
      __x = __x + dVar12;
      dVar9 = floor(dVar8);
      iVar5 = (int)dVar9 >> 4;
      dVar9 = floor(__x);
      iVar7 = (int)dVar9 >> 4;
      if (((iVar5 != iVar4) || (iVar7 != iVar6)) &&
         (iVar2 = isEndChunkEmpty(en,sn,seed,iVar5,iVar7), iVar4 = iVar5, iVar6 = iVar7, iVar2 == 0)
         ) break;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  if (dst != (Pos *)0x0) {
    dVar9 = floor(dVar8);
    dVar8 = floor(__x);
    PVar11.x = (int)dVar9;
    PVar11.z = (int)dVar8;
    *dst = PVar11;
  }
  PVar3.z = iVar6;
  PVar3.x = iVar4;
  return PVar3;
}

Assistant:

Pos getLinkedGatewayChunk(const EndNoise *en, const SurfaceNoise *sn, uint64_t seed,
    Pos src, Pos *dst)
{
    double invr = 1.0 / sqrt(src.x * src.x + src.z * src.z);
    double dx = src.x * invr;
    double dz = src.z * invr;
    double px = dx * 1024;
    double pz = dz * 1024;
    dx *= 16;
    dz *= 16;

    int i;
    Pos c;
    c.x = (int) floor(px) >> 4;
    c.z = (int) floor(pz) >> 4;

    if (isEndChunkEmpty(en, sn, seed, c.x, c.z))
    {   // look forward for the first non-empty chunk
        for (i = 0; i < 15; i++)
        {
            int qx = (int) floor(px += dx) >> 4;
            int qz = (int) floor(pz += dz) >> 4;
            if (qx == c.x && qz == c.z)
                continue;
            c.x = qx;
            c.z = qz;
            if (!isEndChunkEmpty(en, sn, seed, c.x, c.z))
                break;
        }
    }
    else
    {   // look backward for the last non-empty chunk
        for (i = 0; i < 15; i++)
        {
            int qx = (int) floor(px -= dx) >> 4;
            int qz = (int) floor(pz -= dz) >> 4;
            if (isEndChunkEmpty(en, sn, seed, qx, qz))
                break;
            c.x = qx;
            c.z = qz;
        }
    }
    if (dst)
    {
        dst->x = (int) floor(px);
        dst->z = (int) floor(pz);
    }
    return c;
}